

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SimdInt32x4FromFloat32x4<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Type *pTVar1;
  long lVar2;
  long lVar3;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar4;
  undefined1 auStack_30 [8];
  AsmJsSIMDValue input;
  bool throws;
  
  input.field_0.i8[0xf] = '\0';
  pTVar1 = (Type *)(*(long *)(this + 0x148) + (ulong)playout->F4_1 * 0x10);
  auStack_30 = (undefined1  [8])*pTVar1;
  input.field_0.f64[0] = pTVar1[1];
  input.field_0.i8[0xf] = SIMDAnyNaN(this,(AsmJsSIMDValue *)auStack_30);
  if ((bool)input.field_0.i8[0xf]) {
    aVar4 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)ZEXT816(0);
  }
  else {
    aVar4 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
            SIMDInt32x4Operation::OpFromFloat32x4
                      ((SIMDValue *)auStack_30,(bool *)(input.field_0.i8 + 0xf));
  }
  if (input.field_0.i8[0xf] != '\x01') {
    lVar2 = *(long *)(this + 0x148);
    lVar3 = (ulong)playout->I4_0 * 0x10;
    *(Type *)(lVar2 + lVar3) = aVar4.f64[0];
    *(Type *)(lVar2 + 8 + lVar3) = aVar4.f64[1];
    return;
  }
  JavascriptError::ThrowRangeError
            (*(ScriptContext **)(this + 0x78),-0x7ff5ebf6,L"SIMD.Int32x4.FromFloat32x4");
}

Assistant:

void InterpreterStackFrame::OP_SimdInt32x4FromFloat32x4(const unaligned T* playout)
    {
        bool throws = false;
        AsmJsSIMDValue input = GetRegRawSimd(playout->F4_1);
        AsmJsSIMDValue result{ 0 };

#ifdef ENABLE_WASM_SIMD
        throws = SIMDAnyNaN(input);
        if (!throws)
#endif
        {
            result = SIMDInt32x4Operation::OpFromFloat32x4(input, throws);
        }

        // value is out of bound
        if (throws)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("SIMD.Int32x4.FromFloat32x4"));
        }
        SetRegRawSimd(playout->I4_0, result);
    }